

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_copy_to_file.cpp
# Opt level: O1

void __thiscall
duckdb::CopyToFunctionLocalState::FlushPartitions
          (CopyToFunctionLocalState *this,ExecutionContext *context,PhysicalCopyToFile *op,
          CopyToFunctionGlobalState *g)

{
  unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>,_true>
  *this_00;
  _Base_ptr p_Var1;
  copy_to_initialize_local_t p_Var2;
  copy_to_sink_t p_Var3;
  copy_to_combine_t p_Var4;
  ClientContext *pCVar5;
  bool bVar6;
  pointer pHVar7;
  type state;
  vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
  *pvVar8;
  _Base_ptr p_Var9;
  reference this_01;
  pointer this_02;
  DataChunk *source;
  type pFVar10;
  type pGVar11;
  type pLVar12;
  __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  *this_03;
  _Rb_tree_header *p_Var13;
  _Rb_tree_header *p_Var14;
  ulong uVar15;
  unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
  local_copy_state;
  map<unsigned_long,_const_duckdb::HivePartitionKey_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>_>
  partition_key_map;
  DataChunk filtered_chunk;
  ColumnDataChunkIterator __end3;
  ColumnDataChunkIterator __begin3;
  ExecutionContext local_250;
  PartitionWriteInfo *local_238;
  vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
  *local_230;
  ulong local_228;
  CopyToFunctionGlobalState *local_220;
  CopyToFunctionLocalState *local_218;
  vector<unsigned_long,_true> *local_210;
  vector<duckdb::LogicalType,_true> *local_208;
  ColumnDataChunkIterationHelper local_200;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>_>
  local_1e0;
  DataChunk local_1b0;
  ColumnDataChunkIterator local_170;
  ColumnDataChunkIterator local_d0;
  
  if ((this->part_buffer).
      super_unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::HivePartitionedColumnData_*,_std::default_delete<duckdb::HivePartitionedColumnData>_>
      .super__Head_base<0UL,_duckdb::HivePartitionedColumnData_*,_false>._M_head_impl !=
      (HivePartitionedColumnData *)0x0) {
    this_00 = &this->part_buffer;
    local_250.thread = (ThreadContext *)context;
    local_220 = g;
    pHVar7 = unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>,_true>
             ::operator->(this_00);
    local_218 = this;
    state = unique_ptr<duckdb::PartitionedColumnDataAppendState,_std::default_delete<duckdb::PartitionedColumnDataAppendState>,_true>
            ::operator*(&this->part_buffer_append_state);
    PartitionedColumnData::FlushAppendState(&pHVar7->super_PartitionedColumnData,state);
    pHVar7 = unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>,_true>
             ::operator->(this_00);
    pvVar8 = PartitionedColumnData::GetPartitions(&pHVar7->super_PartitionedColumnData);
    pHVar7 = unique_ptr<duckdb::HivePartitionedColumnData,_std::default_delete<duckdb::HivePartitionedColumnData>,_true>
             ::operator->(this_00);
    HivePartitionedColumnData::GetReverseMap
              ((map<unsigned_long,_const_duckdb::HivePartitionKey_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>_>
                *)&local_1e0,pHVar7);
    local_230 = pvVar8;
    if ((pvVar8->
        super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (pvVar8->
        super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
        ).
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_250.pipeline.ptr = (Pipeline *)&op->bind_data;
      local_208 = &op->expected_types;
      local_210 = &op->partition_columns;
      uVar15 = 0;
      do {
        p_Var14 = &local_1e0._M_impl.super__Rb_tree_header;
        p_Var9 = &p_Var14->_M_header;
        for (p_Var1 = local_1e0._M_impl.super__Rb_tree_header._M_header._M_parent;
            (_Rb_tree_header *)p_Var1 != (_Rb_tree_header *)0x0;
            p_Var1 = (&p_Var1->_M_left)[*(ulong *)(p_Var1 + 1) < uVar15]) {
          if (*(ulong *)(p_Var1 + 1) >= uVar15) {
            p_Var9 = p_Var1;
          }
        }
        p_Var13 = p_Var14;
        if (((_Rb_tree_header *)p_Var9 != p_Var14) &&
           (p_Var13 = (_Rb_tree_header *)p_Var9, uVar15 < ((_Rb_tree_header *)p_Var9)->_M_node_count
           )) {
          p_Var13 = p_Var14;
        }
        if (p_Var13 != p_Var14) {
          local_228 = uVar15;
          local_238 = CopyToFunctionGlobalState::GetPartitionWriteInfo
                                (local_220,(ExecutionContext *)local_250.thread,op,
                                 *(vector<duckdb::Value,_true> **)(p_Var13 + 1));
          p_Var2 = (op->function).copy_to_initialize_local;
          unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
          operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                     *)local_250.pipeline.ptr);
          (*p_Var2)(&local_250,(FunctionData *)local_250.thread);
          this_01 = vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
                    ::operator[](local_230,local_228);
          this_02 = unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>
                    ::operator->(this_01);
          ColumnDataCollection::Chunks(&local_200,this_02);
          ColumnDataChunkIterationHelper::begin(&local_d0,&local_200);
          ColumnDataChunkIterationHelper::end(&local_170,&local_200);
          while (bVar6 = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator!=
                                   (&local_d0,&local_170), bVar6) {
            source = ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator*(&local_d0);
            if (op->write_partition_columns == true) {
              p_Var3 = (op->function).copy_to_sink;
              pFVar10 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        ::operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                                     *)local_250.pipeline.ptr);
              pGVar11 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                        ::operator*(&local_238->global_state);
              pLVar12 = unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                        ::operator*((unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                                     *)&local_250);
              (*p_Var3)((ExecutionContext *)local_250.thread,pFVar10,pGVar11,pLVar12,source);
            }
            else {
              DataChunk::DataChunk(&local_1b0);
              SetDataWithoutPartitions(local_218,&local_1b0,source,local_208,local_210);
              p_Var3 = (op->function).copy_to_sink;
              pFVar10 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                        ::operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                                     *)local_250.pipeline.ptr);
              pGVar11 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                        ::operator*(&local_238->global_state);
              pLVar12 = unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                        ::operator*((unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                                     *)&local_250);
              (*p_Var3)((ExecutionContext *)local_250.thread,pFVar10,pGVar11,pLVar12,&local_1b0);
              DataChunk::~DataChunk(&local_1b0);
            }
            ColumnDataChunkIterationHelper::ColumnDataChunkIterator::operator++(&local_d0);
          }
          if (local_170.scan_chunk.internal.
              super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_170.scan_chunk.internal.
                       super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi);
          }
          if (local_170.scan_state.column_ids.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_170.scan_state.column_ids.
                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&local_170.scan_state);
          if (local_d0.scan_chunk.internal.
              super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_d0.scan_chunk.internal.
                       super___shared_ptr<duckdb::DataChunk,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                       ._M_pi);
          }
          if (local_d0.scan_state.column_ids.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d0.scan_state.column_ids.
                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          ::std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::BufferHandle>,_std::allocator<std::pair<const_unsigned_long,_duckdb::BufferHandle>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&local_d0.scan_state);
          if (local_200.column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_200.column_ids.
                            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
          }
          p_Var4 = (op->function).copy_to_combine;
          pFVar10 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                    ::operator*((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                                 *)local_250.pipeline.ptr);
          pGVar11 = unique_ptr<duckdb::GlobalFunctionData,_std::default_delete<duckdb::GlobalFunctionData>,_true>
                    ::operator*(&local_238->global_state);
          pLVar12 = unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                    ::operator*((unique_ptr<duckdb::LocalFunctionData,_std::default_delete<duckdb::LocalFunctionData>,_true>
                                 *)&local_250);
          (*p_Var4)((ExecutionContext *)local_250.thread,pFVar10,pGVar11,pLVar12);
          pCVar5 = local_250.client;
          local_250.client = (ClientContext *)0x0;
          if (pCVar5 != (ClientContext *)0x0) {
            (*(code *)(((pCVar5->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                        internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                      internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)();
          }
          this_03 = (__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                     *)vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_true>
                       ::operator[](local_230,local_228);
          ::std::
          __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
          ::reset(this_03,(pointer)0x0);
          CopyToFunctionGlobalState::FinishPartitionWrite(local_220,local_238);
          uVar15 = local_228;
          if (local_250.client != (ClientContext *)0x0) {
            (*(code *)((((local_250.client)->super_enable_shared_from_this<duckdb::ClientContext>).
                        __weak_this_.internal.
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)();
            uVar15 = local_228;
          }
        }
        uVar15 = uVar15 + 1;
      } while (uVar15 < (ulong)((long)(local_230->
                                      super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(local_230->
                                      super_vector<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                                      ).
                                      super__Vector_base<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>,_true>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    ResetAppendState(local_218);
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>,_std::_Select1st<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_duckdb::HivePartitionKey_*>_>_>
    ::~_Rb_tree(&local_1e0);
  }
  return;
}

Assistant:

void FlushPartitions(ExecutionContext &context, const PhysicalCopyToFile &op, CopyToFunctionGlobalState &g) {
		if (!part_buffer) {
			return;
		}
		part_buffer->FlushAppendState(*part_buffer_append_state);
		auto &partitions = part_buffer->GetPartitions();
		auto partition_key_map = part_buffer->GetReverseMap();

		for (idx_t i = 0; i < partitions.size(); i++) {
			auto entry = partition_key_map.find(i);
			if (entry == partition_key_map.end()) {
				continue;
			}
			// get the partition write info for this buffer
			auto &info = g.GetPartitionWriteInfo(context, op, entry->second->values);

			auto local_copy_state = op.function.copy_to_initialize_local(context, *op.bind_data);
			// push the chunks into the write state
			for (auto &chunk : partitions[i]->Chunks()) {
				if (op.write_partition_columns) {
					op.function.copy_to_sink(context, *op.bind_data, *info.global_state, *local_copy_state, chunk);
				} else {
					DataChunk filtered_chunk;
					SetDataWithoutPartitions(filtered_chunk, chunk, op.expected_types, op.partition_columns);
					op.function.copy_to_sink(context, *op.bind_data, *info.global_state, *local_copy_state,
					                         filtered_chunk);
				}
			}
			op.function.copy_to_combine(context, *op.bind_data, *info.global_state, *local_copy_state);
			local_copy_state.reset();
			partitions[i].reset();
			g.FinishPartitionWrite(info);
		}
		ResetAppendState();
	}